

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_CDict *
ZSTD_createCDict_advanced_internal
          (size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,ZSTD_compressionParameters cParams,
          ZSTD_useRowMatchFinderMode_e useRowMatchFinder,U32 enableDedicatedDictSearch,
          ZSTD_customMem customMem)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t size;
  size_t local_b0;
  ZSTD_CDict *cdict;
  ZSTD_cwksp ws;
  void *workspace;
  size_t workspaceSize;
  U32 enableDedicatedDictSearch_local;
  ZSTD_useRowMatchFinderMode_e useRowMatchFinder_local;
  ZSTD_dictLoadMethod_e dictLoadMethod_local;
  size_t dictSize_local;
  
  if ((customMem.customAlloc == (ZSTD_allocFunction)0x0) ==
      (customMem.customFree == (ZSTD_freeFunction)0x0)) {
    sVar1 = ZSTD_cwksp_alloc_size(0x1390);
    sVar2 = ZSTD_cwksp_alloc_size(0x1900);
    sVar3 = ZSTD_sizeof_matchState(&cParams,useRowMatchFinder,enableDedicatedDictSearch,0);
    if (dictLoadMethod == ZSTD_dlm_byRef) {
      local_b0 = 0;
    }
    else {
      size = ZSTD_cwksp_align(dictSize,8);
      local_b0 = ZSTD_cwksp_alloc_size(size);
    }
    local_b0 = sVar1 + sVar2 + sVar3 + local_b0;
    ws._56_8_ = ZSTD_customMalloc(local_b0,customMem);
    if ((void *)ws._56_8_ == (void *)0x0) {
      ZSTD_customFree((void *)0x0,customMem);
      dictSize_local = 0;
    }
    else {
      ZSTD_cwksp_init((ZSTD_cwksp *)&cdict,(void *)ws._56_8_,local_b0,ZSTD_cwksp_dynamic_alloc);
      dictSize_local = (size_t)ZSTD_cwksp_reserve_object((ZSTD_cwksp *)&cdict,0x1390);
      ZSTD_cwksp_move((ZSTD_cwksp *)(dictSize_local + 0x20),(ZSTD_cwksp *)&cdict);
      *(ZSTD_allocFunction *)(dictSize_local + 0x1368) = customMem.customAlloc;
      *(ZSTD_freeFunction *)(dictSize_local + 0x1370) = customMem.customFree;
      *(void **)(dictSize_local + 0x1378) = customMem.opaque;
      *(undefined4 *)(dictSize_local + 0x1384) = 0;
      *(ZSTD_useRowMatchFinderMode_e *)(dictSize_local + 5000) = useRowMatchFinder;
    }
  }
  else {
    dictSize_local = 0;
  }
  return (ZSTD_CDict *)dictSize_local;
}

Assistant:

static ZSTD_CDict* ZSTD_createCDict_advanced_internal(size_t dictSize,
                                      ZSTD_dictLoadMethod_e dictLoadMethod,
                                      ZSTD_compressionParameters cParams,
                                      ZSTD_useRowMatchFinderMode_e useRowMatchFinder,
                                      U32 enableDedicatedDictSearch,
                                      ZSTD_customMem customMem)
{
    if ((!customMem.customAlloc) ^ (!customMem.customFree)) return NULL;

    {   size_t const workspaceSize =
            ZSTD_cwksp_alloc_size(sizeof(ZSTD_CDict)) +
            ZSTD_cwksp_alloc_size(HUF_WORKSPACE_SIZE) +
            ZSTD_sizeof_matchState(&cParams, useRowMatchFinder, enableDedicatedDictSearch, /* forCCtx */ 0) +
            (dictLoadMethod == ZSTD_dlm_byRef ? 0
             : ZSTD_cwksp_alloc_size(ZSTD_cwksp_align(dictSize, sizeof(void*))));
        void* const workspace = ZSTD_customMalloc(workspaceSize, customMem);
        ZSTD_cwksp ws;
        ZSTD_CDict* cdict;

        if (!workspace) {
            ZSTD_customFree(workspace, customMem);
            return NULL;
        }

        ZSTD_cwksp_init(&ws, workspace, workspaceSize, ZSTD_cwksp_dynamic_alloc);

        cdict = (ZSTD_CDict*)ZSTD_cwksp_reserve_object(&ws, sizeof(ZSTD_CDict));
        assert(cdict != NULL);
        ZSTD_cwksp_move(&cdict->workspace, &ws);
        cdict->customMem = customMem;
        cdict->compressionLevel = ZSTD_NO_CLEVEL; /* signals advanced API usage */
        cdict->useRowMatchFinder = useRowMatchFinder;
        return cdict;
    }
}